

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O3

void __thiscall
CVmObjLookupTable::CVmObjLookupTable(CVmObjLookupTable *this,size_t bucket_cnt,size_t val_cnt)

{
  int iVar1;
  undefined4 extraout_var;
  vm_lookup_ext *this_00;
  
  (this->super_CVmObjCollection).super_CVmObject._vptr_CVmObject =
       (_func_int **)&PTR_get_metaclass_reg_0034a4a0;
  iVar1 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])
                    (G_mem_X->varheap_,
                     (bucket_cnt * 8 + 0x7fffffff8 & 0x7fffffff8) + (val_cnt & 0xffffffff) * 0x28 +
                     0x28,this);
  this_00 = (vm_lookup_ext *)CONCAT44(extraout_var,iVar1);
  this_00->bucket_cnt = (uint)bucket_cnt;
  this_00->value_cnt = (uint)val_cnt;
  (this_00->default_value).typ = VM_NIL;
  (this->super_CVmObjCollection).super_CVmObject.ext_ = (char *)this_00;
  vm_lookup_ext::init_ext(this_00);
  return;
}

Assistant:

CVmObjLookupTable::CVmObjLookupTable(VMG_ size_t bucket_cnt, size_t val_cnt)
{
    vm_val_t empty;

    /* set up an empty value */
    empty.set_empty();
    
    /* allocate our extension structure from the variable heap */
    ext_ = (char *)vm_lookup_ext::alloc_ext(vmg_ this, bucket_cnt, val_cnt);

    /* initialize the extension */
    get_ext()->init_ext();
}